

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlFAGenerateCountedEpsilonTransition
              (xmlRegParserCtxtPtr ctxt,xmlRegStatePtr from,xmlRegStatePtr to,int counter)

{
  xmlRegStatePtr pxStack_28;
  int counter_local;
  xmlRegStatePtr to_local;
  xmlRegStatePtr from_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  pxStack_28 = to;
  if (to == (xmlRegStatePtr)0x0) {
    pxStack_28 = xmlRegStatePush(ctxt);
    if (pxStack_28 == (xmlRegStatePtr)0x0) {
      return -1;
    }
    ctxt->state = pxStack_28;
  }
  xmlRegStateAddTrans(ctxt,from,(xmlRegAtomPtr)0x0,pxStack_28,counter,-1);
  return 0;
}

Assistant:

static int
xmlFAGenerateCountedEpsilonTransition(xmlRegParserCtxtPtr ctxt,
	    xmlRegStatePtr from, xmlRegStatePtr to, int counter) {
    if (to == NULL) {
	to = xmlRegStatePush(ctxt);
        if (to == NULL)
            return(-1);
	ctxt->state = to;
    }
    xmlRegStateAddTrans(ctxt, from, NULL, to, counter, -1);
    return(0);
}